

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XercesNodeTest::XercesNodeTest
          (XercesNodeTest *this,XMLCh *prefix,uint uriId,MemoryManager *manager)

{
  short *psVar1;
  QName *this_00;
  XMLSize_t newLen;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesNodeTest_0040ea28;
  this->fType = 4;
  this_00 = (QName *)XMemory::operator_new(0x48,manager);
  QName::QName(this_00,manager);
  this->fName = this_00;
  this_00->fURIId = uriId;
  newLen = 0;
  if (prefix != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)prefix + newLen);
      newLen = newLen + 2;
    } while (*psVar1 != 0);
    newLen = ((long)newLen >> 1) - 1;
  }
  QName::setNPrefix(this_00,prefix,newLen);
  return;
}

Assistant:

XercesNodeTest::XercesNodeTest(const XMLCh* const prefix,
                               const unsigned int uriId,
                               MemoryManager* const manager)
    : fType(NodeType_NAMESPACE)
    , fName(new (manager) QName(manager))
{
    fName->setURI(uriId);
    fName->setPrefix(prefix);
}